

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O1

void cleanup_buffer_queue(list_head *q,_Bool destroy)

{
  list_head *plVar1;
  list_head *plVar2;
  list_head *__mptr;
  uint uVar3;
  list_head *plVar4;
  
  if (q->next == q) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    plVar4 = q->next;
    do {
      plVar1 = plVar4->next;
      plVar2 = plVar4->prev;
      plVar1->prev = plVar2;
      plVar2->next = plVar1;
      plVar4->next = (list_head *)0x100100;
      plVar4->prev = (list_head *)0x200200;
      if (destroy) {
        aura_buffer_destroy((aura_buffer *)(plVar4 + -2));
      }
      else {
        aura_buffer_release((aura_buffer *)(plVar4 + -2));
      }
      uVar3 = uVar3 + 1;
      plVar4 = plVar1;
    } while (plVar1 != q);
  }
  slog(6,1,"Cleaned up %d buffers",(ulong)uVar3);
  return;
}

Assistant:

static void cleanup_buffer_queue(struct list_head *q, bool destroy)
{
	int i = 0;

	struct list_head *pos, *tmp;

	list_for_each_safe(pos, tmp, q) {
		struct aura_buffer *b;

		b = list_entry(pos, struct aura_buffer, qentry);
		list_del(pos);
		if (!destroy)   /* Just return it to the pool */
			aura_buffer_release(b);
		else            /* Nuke it, we're closing down anyway*/
			aura_buffer_destroy(b);
		i++;
	}
	slog(6, SLOG_LIVE, "Cleaned up %d buffers", i);
}